

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_121b15c::TryRunCommandImpl::RunExecutable
          (TryRunCommandImpl *this,string *runArgs,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *workDir,string *out,string *stdOut,string *stdErr)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  size_t sVar4;
  string *captureStdErr;
  _Alloc_hider dir;
  string *value;
  string_view arg;
  string_view value_00;
  char retChar [16];
  int retVal;
  string finalCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string local_b8;
  uint local_94;
  string local_90;
  string *local_70;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  value = &local_b8;
  local_94 = 0xffffffff;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmCoreTryCompile).Makefile;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_70 = stdErr;
  local_68 = workDir;
  local_60 = stdOut;
  local_58 = out;
  local_50 = runArgs;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"CMAKE_CROSSCOMPILING_EMULATOR","");
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (psVar3->_M_string_length != 0) {
    arg._M_str = (psVar3->_M_dataplus)._M_p;
    arg._M_len = psVar3->_M_string_length;
    cmExpandedList_abi_cxx11_(&local_48,arg,false);
    cmSystemTools::ConvertToRunCommandPath
              (&local_b8,
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_90);
    while (local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start =
                local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1,
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&local_90);
      std::__cxx11::string::_M_append
                ((char *)&local_90,
                 (ulong)((local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_90);
      std::__cxx11::string::append((char *)&local_90);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  cmSystemTools::ConvertToRunCommandPath(&local_b8,&(this->super_cmCoreTryCompile).OutputFile);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_50->_M_string_length != 0) {
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)(local_50->_M_dataplus)._M_p);
  }
  captureStdErr = local_58;
  psVar3 = local_58;
  if (local_60 != (string *)0x0 || local_70 != (string *)0x0) {
    captureStdErr = local_70;
    psVar3 = local_60;
  }
  dir._M_p = (char *)0x0;
  if ((local_68->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged != false) {
    dir._M_p = (local_68->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_dataplus._M_p;
  }
  bVar2 = cmSystemTools::RunSingleCommand
                    (&local_90,psVar3,captureStdErr,(int *)&local_94,dir._M_p,OUTPUT_NONE,
                     (cmDuration)0x0);
  if (bVar2) {
    snprintf((char *)&local_b8,0x10,"%i",(ulong)local_94);
  }
  else {
    value = (string *)0x702baa;
  }
  pcVar1 = (this->super_cmCoreTryCompile).Makefile;
  if (this->NoCache == true) {
    sVar4 = strlen((char *)value);
    value_00._M_str = (char *)value;
    value_00._M_len = sVar4;
    cmMakefile::AddDefinition(pcVar1,&this->RunResultVariable,value_00);
  }
  else {
    cmMakefile::AddCacheDefinition
              (pcVar1,&this->RunResultVariable,(char *)value,"Result of try_run()",INTERNAL,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TryRunCommandImpl::RunExecutable(const std::string& runArgs,
                                      cm::optional<std::string> const& workDir,
                                      std::string* out, std::string* stdOut,
                                      std::string* stdErr)
{
  int retVal = -1;

  std::string finalCommand;
  const std::string& emulator =
    this->Makefile->GetSafeDefinition("CMAKE_CROSSCOMPILING_EMULATOR");
  if (!emulator.empty()) {
    std::vector<std::string> emulatorWithArgs = cmExpandedList(emulator);
    finalCommand +=
      cmSystemTools::ConvertToRunCommandPath(emulatorWithArgs[0]);
    finalCommand += " ";
    for (std::string const& arg : cmMakeRange(emulatorWithArgs).advance(1)) {
      finalCommand += "\"";
      finalCommand += arg;
      finalCommand += "\"";
      finalCommand += " ";
    }
  }
  finalCommand += cmSystemTools::ConvertToRunCommandPath(this->OutputFile);
  if (!runArgs.empty()) {
    finalCommand += runArgs;
  }
  bool worked = cmSystemTools::RunSingleCommand(
    finalCommand, stdOut || stdErr ? stdOut : out,
    stdOut || stdErr ? stdErr : out, &retVal,
    workDir ? workDir->c_str() : nullptr, cmSystemTools::OUTPUT_NONE,
    cmDuration::zero());
  // set the run var
  char retChar[16];
  const char* retStr;
  if (worked) {
    snprintf(retChar, sizeof(retChar), "%i", retVal);
    retStr = retChar;
  } else {
    retStr = "FAILED_TO_RUN";
  }
  if (this->NoCache) {
    this->Makefile->AddDefinition(this->RunResultVariable, retStr);
  } else {
    this->Makefile->AddCacheDefinition(this->RunResultVariable, retStr,
                                       "Result of try_run()",
                                       cmStateEnums::INTERNAL);
  }
}